

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O2

void HTS_Engine_save_information(HTS_Engine *engine,FILE *fp)

{
  HTS_ModelSet *ms;
  double *pdVar1;
  ulong voice_index;
  HTS_PStreamSet *pss;
  HTS_Boolean HVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  HTS_Label *label;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double local_78;
  ulong local_68;
  HTS_Label *local_60;
  ulong local_58;
  HTS_SStreamSet *local_50;
  HTS_PStreamSet *local_48;
  size_t n;
  size_t m;
  
  fwrite("[Global parameter]\n",0x13,1,(FILE *)fp);
  fprintf((FILE *)fp,"Sampring frequency                     -> %8lu(Hz)\n",
          (engine->condition).sampling_frequency);
  fprintf((FILE *)fp,"Frame period                           -> %8lu(point)\n",
          (engine->condition).fperiod);
  sVar3 = (engine->condition).fperiod;
  sVar4 = (engine->condition).sampling_frequency;
  fprintf((FILE *)fp,"                                          %8.5f(msec)\n",
          ((((double)CONCAT44(0x45300000,(int)(sVar3 >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) * 1000.0) /
          (((double)CONCAT44(0x45300000,(int)(sVar4 >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)));
  fprintf((FILE *)fp,"All-pass constant                      -> %8.5f\n",
          (double)(float)(engine->condition).alpha);
  ms = &engine->ms;
  fprintf((FILE *)fp,"Gamma                                  -> %8.5f\n");
  if ((engine->condition).stage != 0) {
    pcVar6 = "Log gain flag                          ->    FALSE\n";
    if ((engine->condition).use_log_gain == '\x01') {
      pcVar6 = "Log gain flag                          ->     TRUE\n";
    }
    fwrite(pcVar6,0x33,1,(FILE *)fp);
  }
  local_50 = &engine->sss;
  local_48 = &engine->pss;
  fprintf((FILE *)fp,"Postfiltering coefficient              -> %8.5f\n",
          (double)(float)(engine->condition).beta);
  fprintf((FILE *)fp,"Audio buffer size                      -> %8lu(sample)\n",
          (engine->condition).audio_buff_size);
  fputc(10,(FILE *)fp);
  fwrite("[Duration parameter]\n",0x15,1,(FILE *)fp);
  sVar3 = HTS_ModelSet_get_nstate(ms);
  fprintf((FILE *)fp,"Number of states                       -> %8lu\n",sVar3);
  sVar3 = HTS_ModelSet_get_nvoices(ms);
  fprintf((FILE *)fp,"         Interpolation size            -> %8lu\n",sVar3);
  local_60 = (HTS_Label *)0x0;
  for (uVar8 = 0; sVar3 = HTS_ModelSet_get_nvoices(ms), uVar8 < sVar3; uVar8 = uVar8 + 1) {
    local_60 = (HTS_Label *)((double)local_60 + (engine->condition).duration_iw[uVar8]);
  }
  for (uVar8 = 0; sVar3 = HTS_ModelSet_get_nvoices(ms), uVar8 < sVar3; uVar8 = uVar8 + 1) {
    pdVar1 = (engine->condition).duration_iw;
    dVar10 = pdVar1[uVar8];
    if ((dVar10 != 0.0) || (NAN(dVar10))) {
      pdVar1[uVar8] = dVar10 / (double)local_60;
    }
  }
  local_60 = &engine->label;
  for (uVar8 = 0; sVar3 = HTS_ModelSet_get_nvoices(ms), uVar8 < sVar3; uVar8 = uVar8 + 1) {
    fprintf((FILE *)fp,"         Interpolation weight[%2lu]      -> %8.0f(%%)\n",
            (double)(float)((engine->condition).duration_iw[uVar8] * 100.0),uVar8);
  }
  fputc(10,(FILE *)fp);
  fwrite("[Stream parameter]\n",0x13,1,(FILE *)fp);
  label = local_60;
  for (uVar8 = 0; sVar3 = HTS_ModelSet_get_nstream(ms), uVar8 < sVar3; uVar8 = uVar8 + 1) {
    sVar3 = HTS_ModelSet_get_vector_length(ms,uVar8);
    fprintf((FILE *)fp,"Stream[%2lu] vector length               -> %8lu\n",uVar8,sVar3);
    sVar3 = HTS_ModelSet_get_window_size(ms,uVar8);
    fprintf((FILE *)fp,"           Dynamic window size         -> %8lu\n",sVar3);
    sVar3 = HTS_ModelSet_get_nvoices(ms);
    fprintf((FILE *)fp,"           Interpolation size          -> %8lu\n",sVar3);
    local_78 = 0.0;
    for (uVar9 = 0; sVar3 = HTS_ModelSet_get_nvoices(ms), uVar9 < sVar3; uVar9 = uVar9 + 1) {
      local_78 = local_78 + (engine->condition).parameter_iw[uVar9][uVar8];
    }
    for (uVar9 = 0; sVar3 = HTS_ModelSet_get_nvoices(ms), uVar9 < sVar3; uVar9 = uVar9 + 1) {
      pdVar1 = (engine->condition).parameter_iw[uVar9];
      dVar10 = pdVar1[uVar8];
      if ((dVar10 != 0.0) || (NAN(dVar10))) {
        pdVar1[uVar8] = dVar10 / local_78;
      }
    }
    for (uVar9 = 0; sVar3 = HTS_ModelSet_get_nvoices(ms), uVar9 < sVar3; uVar9 = uVar9 + 1) {
      fprintf((FILE *)fp,"           Interpolation weight[%2lu]    -> %8.0f(%%)\n",
              (double)(float)((engine->condition).parameter_iw[uVar9][uVar8] * 100.0),uVar9);
    }
    HVar2 = HTS_ModelSet_is_msd(ms,uVar8);
    if (HVar2 == '\0') {
      fwrite("           MSD flag                    ->    FALSE\n",0x33,1,(FILE *)fp);
    }
    else {
      fwrite("           MSD flag                    ->     TRUE\n",0x33,1,(FILE *)fp);
      fprintf((FILE *)fp,"           MSD threshold               -> %8.5f\n",
              (engine->condition).msd_threshold[uVar8]);
    }
    HVar2 = HTS_ModelSet_use_gv(ms,uVar8);
    if (HVar2 == '\0') {
      fwrite("           GV flag                     ->    FALSE\n",0x33,1,(FILE *)fp);
    }
    else {
      fwrite("           GV flag                     ->     TRUE\n",0x33,1,(FILE *)fp);
      fprintf((FILE *)fp,"           GV weight                   -> %8.0f(%%)\n",
              (double)(float)((engine->condition).gv_weight[uVar8] * 100.0));
      sVar3 = HTS_ModelSet_get_nvoices(ms);
      fprintf((FILE *)fp,"           GV interpolation size       -> %8lu\n",sVar3);
      local_78 = 0.0;
      for (uVar9 = 0; sVar3 = HTS_ModelSet_get_nvoices(ms), uVar9 < sVar3; uVar9 = uVar9 + 1) {
        local_78 = local_78 + (engine->condition).gv_iw[uVar9][uVar8];
      }
      for (uVar9 = 0; sVar3 = HTS_ModelSet_get_nvoices(ms), uVar9 < sVar3; uVar9 = uVar9 + 1) {
        pdVar1 = (engine->condition).gv_iw[uVar9];
        dVar10 = pdVar1[uVar8];
        if ((dVar10 != 0.0) || (NAN(dVar10))) {
          pdVar1[uVar8] = dVar10 / local_78;
        }
      }
      for (uVar9 = 0; sVar3 = HTS_ModelSet_get_nvoices(ms), uVar9 < sVar3; uVar9 = uVar9 + 1) {
        fprintf((FILE *)fp,"           GV interpolation weight[%2lu] -> %8.0f(%%)\n",
                (double)(float)((engine->condition).gv_iw[uVar9][uVar8] * 100.0),uVar9);
      }
    }
  }
  fputc(10,(FILE *)fp);
  fwrite("[Generated sequence]\n",0x15,1,(FILE *)fp);
  sVar3 = HTS_Label_get_size(label);
  fprintf((FILE *)fp,"Number of HMMs                         -> %8lu\n",sVar3);
  sVar3 = HTS_Label_get_size(label);
  sVar4 = HTS_ModelSet_get_nstate(ms);
  fprintf((FILE *)fp,"Number of stats                        -> %8lu\n",sVar3 * sVar4);
  pss = local_48;
  sVar5 = HTS_PStreamSet_get_total_frame(local_48);
  auVar11._8_4_ = (int)(sVar5 >> 0x20);
  auVar11._0_8_ = sVar5;
  auVar11._12_4_ = 0x45300000;
  sVar3 = (engine->condition).fperiod;
  auVar12._8_4_ = (int)(sVar3 >> 0x20);
  auVar12._0_8_ = sVar3;
  auVar12._12_4_ = 0x45300000;
  sVar4 = (engine->condition).sampling_frequency;
  auVar13._8_4_ = (int)(sVar4 >> 0x20);
  auVar13._0_8_ = sVar4;
  auVar13._12_4_ = 0x45300000;
  fprintf((FILE *)fp,"Length of this speech                  -> %8.3f(sec)\n",
          (double)(float)((((auVar12._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) *
                          ((auVar11._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0))) /
                         ((auVar13._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0))));
  sVar3 = HTS_PStreamSet_get_total_frame(pss);
  fprintf((FILE *)fp,"                                       -> %8lu(frames)\n",
          sVar3 * (engine->condition).fperiod);
  for (uVar8 = 0; sVar3 = HTS_Label_get_size(label), uVar8 < sVar3; uVar8 = uVar8 + 1) {
    fprintf((FILE *)fp,"HMM[%2lu]\n",uVar8);
    pcVar6 = HTS_Label_get_string(label,uVar8);
    fprintf((FILE *)fp,"  Name                                 -> %s\n",pcVar6);
    fwrite("  Duration\n",0xb,1,(FILE *)fp);
    for (uVar9 = 0; sVar3 = HTS_ModelSet_get_nvoices(ms), uVar9 < sVar3; uVar9 = uVar9 + 1) {
      fprintf((FILE *)fp,"    Interpolation[%2lu]\n",uVar9);
      pcVar6 = HTS_Label_get_string(label,uVar8);
      HTS_ModelSet_get_duration_index(ms,uVar9,pcVar6,&local_68,&local_58);
      fprintf((FILE *)fp,"      Tree index                       -> %8lu\n",local_68);
      fprintf((FILE *)fp,"      PDF index                        -> %8lu\n",local_58);
    }
    for (uVar9 = 0; sVar3 = HTS_ModelSet_get_nstate(ms), uVar9 < sVar3; uVar9 = uVar9 + 1) {
      fprintf((FILE *)fp,"  State[%2lu]\n",uVar9 + 2);
      sVar3 = HTS_ModelSet_get_nstate(ms);
      sVar3 = HTS_SStreamSet_get_duration(local_50,sVar3 * uVar8 + uVar9);
      fprintf((FILE *)fp,"    Length                             -> %8lu(frames)\n",sVar3);
      uVar7 = 0;
      while (local_68 = uVar7, sVar3 = HTS_ModelSet_get_nstream(ms), uVar7 < sVar3) {
        fprintf((FILE *)fp,"    Stream[%2lu]\n",local_68);
        HVar2 = HTS_ModelSet_is_msd(ms,local_68);
        uVar7 = local_68;
        if (HVar2 != '\0') {
          sVar3 = HTS_ModelSet_get_nstate(ms);
          dVar10 = HTS_SStreamSet_get_msd(local_50,uVar7,sVar3 * uVar8 + uVar9);
          pdVar1 = (engine->condition).msd_threshold + local_68;
          pcVar6 = "      MSD flag                         ->    FALSE\n";
          if (*pdVar1 <= dVar10 && dVar10 != *pdVar1) {
            pcVar6 = "      MSD flag                         ->     TRUE\n";
          }
          fwrite(pcVar6,0x33,1,(FILE *)fp);
        }
        uVar7 = 0;
        while (local_58 = uVar7, sVar3 = HTS_ModelSet_get_nvoices(ms), uVar7 < sVar3) {
          fprintf((FILE *)fp,"      Interpolation[%2lu]\n",local_58);
          voice_index = local_58;
          uVar7 = local_68;
          pcVar6 = HTS_Label_get_string(local_60,uVar8);
          HTS_ModelSet_get_parameter_index(ms,voice_index,uVar7,uVar9 + 2,pcVar6,&m,&n);
          fprintf((FILE *)fp,"        Tree index                     -> %8lu\n",m);
          fprintf((FILE *)fp,"        PDF index                      -> %8lu\n",n);
          uVar7 = local_58 + 1;
        }
        uVar7 = local_68 + 1;
      }
      label = local_60;
    }
  }
  return;
}

Assistant:

void HTS_Engine_save_information(HTS_Engine * engine, FILE * fp)
{
   size_t i, j, k, l, m, n;
   double temp;
   HTS_Condition *condition = &engine->condition;
   HTS_ModelSet *ms = &engine->ms;
   HTS_Label *label = &engine->label;
   HTS_SStreamSet *sss = &engine->sss;
   HTS_PStreamSet *pss = &engine->pss;

   /* global parameter */
   fprintf(fp, "[Global parameter]\n");
   fprintf(fp, "Sampring frequency                     -> %8lu(Hz)\n", (unsigned long) condition->sampling_frequency);
   fprintf(fp, "Frame period                           -> %8lu(point)\n", (unsigned long) condition->fperiod);
   fprintf(fp, "                                          %8.5f(msec)\n", 1e+3 * condition->fperiod / condition->sampling_frequency);
   fprintf(fp, "All-pass constant                      -> %8.5f\n", (float) condition->alpha);
   fprintf(fp, "Gamma                                  -> %8.5f\n", (float) (condition->stage == 0 ? 0.0 : -1.0 / condition->stage));
   if (condition->stage != 0) {
      if (condition->use_log_gain == TRUE)
         fprintf(fp, "Log gain flag                          ->     TRUE\n");
      else
         fprintf(fp, "Log gain flag                          ->    FALSE\n");
   }
   fprintf(fp, "Postfiltering coefficient              -> %8.5f\n", (float) condition->beta);
   fprintf(fp, "Audio buffer size                      -> %8lu(sample)\n", (unsigned long) condition->audio_buff_size);
   fprintf(fp, "\n");

   /* duration parameter */
   fprintf(fp, "[Duration parameter]\n");
   fprintf(fp, "Number of states                       -> %8lu\n", (unsigned long) HTS_ModelSet_get_nstate(ms));
   fprintf(fp, "         Interpolation size            -> %8lu\n", (unsigned long) HTS_ModelSet_get_nvoices(ms));
   /* check interpolation */
   for (i = 0, temp = 0.0; i < HTS_ModelSet_get_nvoices(ms); i++)
      temp += condition->duration_iw[i];
   for (i = 0; i < HTS_ModelSet_get_nvoices(ms); i++)
      if (condition->duration_iw[i] != 0.0)
         condition->duration_iw[i] /= temp;
   for (i = 0; i < HTS_ModelSet_get_nvoices(ms); i++)
      fprintf(fp, "         Interpolation weight[%2lu]      -> %8.0f(%%)\n", (unsigned long) i, (float) (100 * condition->duration_iw[i]));
   fprintf(fp, "\n");

   fprintf(fp, "[Stream parameter]\n");
   for (i = 0; i < HTS_ModelSet_get_nstream(ms); i++) {
      /* stream parameter */
      fprintf(fp, "Stream[%2lu] vector length               -> %8lu\n", (unsigned long) i, (unsigned long) HTS_ModelSet_get_vector_length(ms, i));
      fprintf(fp, "           Dynamic window size         -> %8lu\n", (unsigned long) HTS_ModelSet_get_window_size(ms, i));
      /* interpolation */
      fprintf(fp, "           Interpolation size          -> %8lu\n", (unsigned long) HTS_ModelSet_get_nvoices(ms));
      for (j = 0, temp = 0.0; j < HTS_ModelSet_get_nvoices(ms); j++)
         temp += condition->parameter_iw[j][i];
      for (j = 0; j < HTS_ModelSet_get_nvoices(ms); j++)
         if (condition->parameter_iw[j][i] != 0.0)
            condition->parameter_iw[j][i] /= temp;
      for (j = 0; j < HTS_ModelSet_get_nvoices(ms); j++)
         fprintf(fp, "           Interpolation weight[%2lu]    -> %8.0f(%%)\n", (unsigned long) j, (float) (100 * condition->parameter_iw[j][i]));
      /* MSD */
      if (HTS_ModelSet_is_msd(ms, i)) { /* for MSD */
         fprintf(fp, "           MSD flag                    ->     TRUE\n");
         fprintf(fp, "           MSD threshold               -> %8.5f\n", condition->msd_threshold[i]);
      } else {                  /* for non MSD */
         fprintf(fp, "           MSD flag                    ->    FALSE\n");
      }
      /* GV */
      if (HTS_ModelSet_use_gv(ms, i)) {
         fprintf(fp, "           GV flag                     ->     TRUE\n");
         fprintf(fp, "           GV weight                   -> %8.0f(%%)\n", (float) (100 * condition->gv_weight[i]));
         fprintf(fp, "           GV interpolation size       -> %8lu\n", (unsigned long) HTS_ModelSet_get_nvoices(ms));
         /* interpolation */
         for (j = 0, temp = 0.0; j < HTS_ModelSet_get_nvoices(ms); j++)
            temp += condition->gv_iw[j][i];
         for (j = 0; j < HTS_ModelSet_get_nvoices(ms); j++)
            if (condition->gv_iw[j][i] != 0.0)
               condition->gv_iw[j][i] /= temp;
         for (j = 0; j < HTS_ModelSet_get_nvoices(ms); j++)
            fprintf(fp, "           GV interpolation weight[%2lu] -> %8.0f(%%)\n", (unsigned long) j, (float) (100 * condition->gv_iw[j][i]));
      } else {
         fprintf(fp, "           GV flag                     ->    FALSE\n");
      }
   }
   fprintf(fp, "\n");

   /* generated sequence */
   fprintf(fp, "[Generated sequence]\n");
   fprintf(fp, "Number of HMMs                         -> %8lu\n", (unsigned long) HTS_Label_get_size(label));
   fprintf(fp, "Number of stats                        -> %8lu\n", (unsigned long) HTS_Label_get_size(label) * HTS_ModelSet_get_nstate(ms));
   fprintf(fp, "Length of this speech                  -> %8.3f(sec)\n", (float) ((double) HTS_PStreamSet_get_total_frame(pss) * condition->fperiod / condition->sampling_frequency));
   fprintf(fp, "                                       -> %8lu(frames)\n", (unsigned long) HTS_PStreamSet_get_total_frame(pss) * condition->fperiod);

   for (i = 0; i < HTS_Label_get_size(label); i++) {
      fprintf(fp, "HMM[%2lu]\n", (unsigned long) i);
      fprintf(fp, "  Name                                 -> %s\n", HTS_Label_get_string(label, i));
      fprintf(fp, "  Duration\n");
      for (j = 0; j < HTS_ModelSet_get_nvoices(ms); j++) {
         fprintf(fp, "    Interpolation[%2lu]\n", (unsigned long) j);
         HTS_ModelSet_get_duration_index(ms, j, HTS_Label_get_string(label, i), &k, &l);
         fprintf(fp, "      Tree index                       -> %8lu\n", (unsigned long) k);
         fprintf(fp, "      PDF index                        -> %8lu\n", (unsigned long) l);
      }
      for (j = 0; j < HTS_ModelSet_get_nstate(ms); j++) {
         fprintf(fp, "  State[%2lu]\n", (unsigned long) j + 2);
         fprintf(fp, "    Length                             -> %8lu(frames)\n", (unsigned long) HTS_SStreamSet_get_duration(sss, i * HTS_ModelSet_get_nstate(ms) + j));
         for (k = 0; k < HTS_ModelSet_get_nstream(ms); k++) {
            fprintf(fp, "    Stream[%2lu]\n", (unsigned long) k);
            if (HTS_ModelSet_is_msd(ms, k)) {
               if (HTS_SStreamSet_get_msd(sss, k, i * HTS_ModelSet_get_nstate(ms) + j) > condition->msd_threshold[k])
                  fprintf(fp, "      MSD flag                         ->     TRUE\n");
               else
                  fprintf(fp, "      MSD flag                         ->    FALSE\n");
            }
            for (l = 0; l < HTS_ModelSet_get_nvoices(ms); l++) {
               fprintf(fp, "      Interpolation[%2lu]\n", (unsigned long) l);
               HTS_ModelSet_get_parameter_index(ms, l, k, j + 2, HTS_Label_get_string(label, i), &m, &n);
               fprintf(fp, "        Tree index                     -> %8lu\n", (unsigned long) m);
               fprintf(fp, "        PDF index                      -> %8lu\n", (unsigned long) n);
            }
         }
      }
   }
}